

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O0

bool io_buf::is_socket(int f)

{
  int _nhandle;
  int f_local;
  
  return 0x1f < f;
}

Assistant:

bool io_buf::is_socket(int f)
{
  // this appears to work in practice, but could probably be done in a cleaner fashion
#ifdef _WIN32
  const int _nhandle = _getmaxstdio() / 2;
  return f >= _nhandle;
#else
  const int _nhandle = 32;
  return f >= _nhandle;
#endif
}